

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

LPBYTE __thiscall TRootHandler_MNDX::Search(TRootHandler_MNDX *this,TCascSearch *hs)

{
  bool bVar1;
  TFileNameDatabase *this_00;
  LPBYTE pBVar2;
  bool local_31;
  TFileNameDatabase *pTStack_30;
  bool bFindResult;
  TMndxSearch *pSearch;
  TMndxMarFile *pMarFile;
  TCascSearch *hs_local;
  TRootHandler_MNDX *this_local;
  
  pSearch = (TMndxSearch *)(this->MndxInfo).MarFiles[2];
  pTStack_30 = (TFileNameDatabase *)0x0;
  local_31 = false;
  pMarFile = (TMndxMarFile *)hs;
  hs_local = (TCascSearch *)this;
  if (hs->pRootContext == (void *)0x0) {
    this_00 = (TFileNameDatabase *)operator_new(0x30);
    TMndxSearch::TMndxSearch((TMndxSearch *)this_00);
    if (this_00 == (TFileNameDatabase *)0x0) {
      return (LPBYTE)0x0;
    }
    pTStack_30 = this_00;
    TMndxSearch::SetSearchMask((TMndxSearch *)this_00,"",0);
    pMarFile[0x2d].pDatabase = pTStack_30;
  }
  if (pMarFile[0x2d].pDatabase == (TFileNameDatabase *)0x0) {
    __assert_fail("hs->pRootContext != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                  ,0xbbf,"virtual LPBYTE TRootHandler_MNDX::Search(TCascSearch *)");
  }
  pTStack_30 = pMarFile[0x2d].pDatabase;
  do {
    TMndxMarFile::DoSearch((TMndxMarFile *)pSearch,(TMndxSearch *)pTStack_30,&local_31);
    if ((local_31 & 1U) == 0) {
      return (LPBYTE)0x0;
    }
    if ((pMarFile[1].pbMarData == (LPBYTE)0x0) || (*pMarFile[1].pbMarData == '\0')) break;
    memcpy(&pMarFile[1].cbMarData,*(char **)&(pTStack_30->CollisionTable).ItemBits.bIsValidArray,
           (pTStack_30->CollisionTable).TotalItemCount);
    *(undefined1 *)((long)&pMarFile[1].cbMarData + (pTStack_30->CollisionTable).TotalItemCount) = 0;
    bVar1 = CheckWildCard((char *)&pMarFile[1].cbMarData,(char *)pMarFile[1].pbMarData);
  } while (!bVar1);
  pBVar2 = FillFindData(this,(TCascSearch *)pMarFile,(TMndxSearch *)pTStack_30);
  return pBVar2;
}

Assistant:

LPBYTE Search(TCascSearch * hs)
    {
        TMndxMarFile * pMarFile = MndxInfo.MarFiles[2];
        TMndxSearch * pSearch = NULL;
        bool bFindResult = false;

        // If the first time, allocate the structure for the search result
        if(hs->pRootContext == NULL)
        {
            // Create the new search structure
            pSearch = new TMndxSearch;
            if(pSearch == NULL)
                return NULL;

            // Setup the search mask
            pSearch->SetSearchMask("", 0);
            hs->pRootContext = pSearch;
        }

        // Make shortcut for the search structure
        assert(hs->pRootContext != NULL);
        pSearch = (TMndxSearch *)hs->pRootContext;

        // Keep searching
        for(;;)
        {
            // Search the next file name
            pMarFile->DoSearch(pSearch, &bFindResult);
            if (bFindResult == false)
                return NULL;

            // If we have no wild mask, we found it
            if (hs->szMask == NULL || hs->szMask[0] == 0)
                break;

            // Copy the found name to the buffer
            memcpy(hs->szFileName, pSearch->szFoundPath, pSearch->cchFoundPath);
            hs->szFileName[pSearch->cchFoundPath] = 0;
            if (CheckWildCard(hs->szFileName, hs->szMask))
                break;
        }

        // Give the file size and CKey
        return FillFindData(hs, pSearch);
    }